

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O1

void lowbd_fwd_txfm2d_16x64_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int8_t *piVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  longlong *plVar9;
  bool bVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  __m256i buf0 [64];
  __m256i buf1 [64];
  longlong local_1060 [518];
  
  piVar5 = av1_fwd_txfm_shift_ls[0x11];
  lVar8 = 0;
  do {
    uVar2 = *(undefined8 *)(input + 4);
    uVar3 = *(undefined8 *)(input + 8);
    uVar4 = *(undefined8 *)(input + 0xc);
    *(undefined8 *)((long)local_1060 + lVar8) = *(undefined8 *)input;
    *(undefined8 *)((long)local_1060 + lVar8 + 8) = uVar2;
    *(undefined8 *)((long)local_1060 + lVar8 + 0x10) = uVar3;
    *(undefined8 *)((long)local_1060 + lVar8 + 0x18) = uVar4;
    lVar8 = lVar8 + 0x20;
    input = input + stride;
  } while (lVar8 != 0x800);
  bVar1 = *av1_fwd_txfm_shift_ls[0x11];
  uVar7 = (uint)(char)bVar1;
  if ((int)uVar7 < 0) {
    auVar11._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
    auVar11._2_2_ = auVar11._0_2_;
    auVar11._4_2_ = auVar11._0_2_;
    auVar11._6_2_ = auVar11._0_2_;
    auVar11._8_2_ = auVar11._0_2_;
    auVar11._10_2_ = auVar11._0_2_;
    auVar11._12_2_ = auVar11._0_2_;
    auVar11._14_2_ = auVar11._0_2_;
    auVar11._16_2_ = auVar11._0_2_;
    auVar11._18_2_ = auVar11._0_2_;
    auVar11._20_2_ = auVar11._0_2_;
    auVar11._22_2_ = auVar11._0_2_;
    auVar11._24_2_ = auVar11._0_2_;
    auVar11._26_2_ = auVar11._0_2_;
    auVar11._28_2_ = auVar11._0_2_;
    auVar11._30_2_ = auVar11._0_2_;
    lVar8 = 0;
    do {
      auVar12 = vpaddsw_avx2(auVar11,*(undefined1 (*) [32])((long)local_1060 + lVar8));
      auVar12 = vpsraw_avx2(auVar12,ZEXT416(-uVar7));
      *(undefined1 (*) [32])((long)local_1060 + lVar8) = auVar12;
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0x800);
  }
  else if (bVar1 != 0) {
    lVar8 = 0;
    do {
      auVar11 = vpsllw_avx2(*(undefined1 (*) [32])((long)local_1060 + lVar8),ZEXT416(uVar7));
      *(undefined1 (*) [32])((long)local_1060 + lVar8) = auVar11;
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0x800);
  }
  fdct16x64_new_avx2((__m256i *)local_1060,(__m256i *)local_1060,'\r');
  bVar1 = piVar5[1];
  if ((char)bVar1 < '\0') {
    auVar12._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
    auVar12._2_2_ = auVar12._0_2_;
    auVar12._4_2_ = auVar12._0_2_;
    auVar12._6_2_ = auVar12._0_2_;
    auVar12._8_2_ = auVar12._0_2_;
    auVar12._10_2_ = auVar12._0_2_;
    auVar12._12_2_ = auVar12._0_2_;
    auVar12._14_2_ = auVar12._0_2_;
    auVar12._16_2_ = auVar12._0_2_;
    auVar12._18_2_ = auVar12._0_2_;
    auVar12._20_2_ = auVar12._0_2_;
    auVar12._22_2_ = auVar12._0_2_;
    auVar12._24_2_ = auVar12._0_2_;
    auVar12._26_2_ = auVar12._0_2_;
    auVar12._28_2_ = auVar12._0_2_;
    auVar12._30_2_ = auVar12._0_2_;
    lVar8 = 0;
    do {
      auVar11 = vpaddsw_avx2(auVar12,*(undefined1 (*) [32])((long)local_1060 + lVar8));
      auVar11 = vpsraw_avx2(auVar11,ZEXT416((uint)-(int)(char)bVar1));
      *(undefined1 (*) [32])((long)local_1060 + lVar8) = auVar11;
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0x800);
  }
  else if (bVar1 != 0) {
    lVar8 = 0;
    do {
      auVar11 = vpsllw_avx2(*(undefined1 (*) [32])((long)local_1060 + lVar8),
                            ZEXT416((uint)(int)(char)bVar1));
      *(undefined1 (*) [32])((long)local_1060 + lVar8) = auVar11;
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0x800);
  }
  lVar8 = 0;
  do {
    transpose_16bit_16x16_avx2
              ((__m256i *)((long)local_1060 + lVar8),(__m256i *)((long)local_1060 + lVar8 + 0x800));
    lVar8 = lVar8 + 0x200;
  } while (lVar8 != 0x800);
  plVar9 = local_1060 + 0x100;
  lVar8 = 0;
  do {
    fdct16x16_new_avx2((__m256i *)(local_1060 + lVar8 * 0x40 + 0x100),
                       (__m256i *)(local_1060 + lVar8 * 0x40 + 0x100),'\f');
    bVar1 = piVar5[2];
    if ((char)bVar1 < '\0') {
      auVar13._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
      auVar13._2_2_ = auVar13._0_2_;
      auVar13._4_2_ = auVar13._0_2_;
      auVar13._6_2_ = auVar13._0_2_;
      auVar13._8_2_ = auVar13._0_2_;
      auVar13._10_2_ = auVar13._0_2_;
      auVar13._12_2_ = auVar13._0_2_;
      auVar13._14_2_ = auVar13._0_2_;
      auVar13._16_2_ = auVar13._0_2_;
      auVar13._18_2_ = auVar13._0_2_;
      auVar13._20_2_ = auVar13._0_2_;
      auVar13._22_2_ = auVar13._0_2_;
      auVar13._24_2_ = auVar13._0_2_;
      auVar13._26_2_ = auVar13._0_2_;
      auVar13._28_2_ = auVar13._0_2_;
      auVar13._30_2_ = auVar13._0_2_;
      lVar6 = 0;
      do {
        auVar11 = vpaddsw_avx2(auVar13,*(undefined1 (*) [32])((long)plVar9 + lVar6));
        auVar11 = vpsraw_avx2(auVar11,ZEXT416((uint)-(int)(char)bVar1));
        *(undefined1 (*) [32])((long)plVar9 + lVar6) = auVar11;
        lVar6 = lVar6 + 0x20;
      } while (lVar6 != 0x200);
    }
    else if (bVar1 != 0) {
      lVar6 = 0;
      do {
        auVar11 = vpsllw_avx2(*(undefined1 (*) [32])((long)plVar9 + lVar6),
                              ZEXT416((uint)(int)(char)bVar1));
        *(undefined1 (*) [32])((long)plVar9 + lVar6) = auVar11;
        lVar6 = lVar6 + 0x20;
      } while (lVar6 != 0x200);
    }
    lVar6 = 0;
    do {
      auVar11 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)plVar9 + lVar6));
      auVar12 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)plVar9 + lVar6 + 0x10));
      *(undefined1 (*) [32])(output + lVar6) = auVar11;
      *(undefined1 (*) [32])(output + lVar6 + 8) = auVar12;
      lVar6 = lVar6 + 0x20;
    } while (lVar6 != 0x200);
    plVar9 = plVar9 + 0x40;
    output = output + 0x10;
    bVar10 = lVar8 == 0;
    lVar8 = lVar8 + 1;
  } while (bVar10);
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_16x64_avx2(const int16_t *input, int32_t *output,
                                        int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  (void)tx_type;
  assert(tx_type == DCT_DCT);
  const TX_SIZE tx_size = TX_16X64;
  __m256i buf0[64], buf1[64];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_avx2 col_txfm = fdct16x64_new_avx2;
  const transform_1d_avx2 row_txfm = fdct16x16_new_avx2;
  const int width_div16 = (width >> 4);
  const int height_div16 = (height >> 4);

  for (int i = 0; i < width_div16; i++) {
    load_buffer_16bit_to_16bit_avx2(input + 16 * i, stride, buf0, height);
    round_shift_16bit_w16_avx2(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit_w16_avx2(buf0, height, shift[1]);
    for (int j = 0; j < height_div16; ++j) {
      transpose_16bit_16x16_avx2(buf0 + j * 16, buf1 + j * width + 16 * i);
    }
  }

  for (int i = 0; i < AOMMIN(2, height_div16); i++) {
    __m256i *buf = buf1 + width * i;
    row_txfm(buf, buf, cos_bit_row);
    round_shift_16bit_w16_avx2(buf, width, shift[2]);
    store_buffer_16bit_to_32bit_w16_avx2(buf, output + width * i, 32, width);
  }
}